

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QGenericArrayOps<QCss::MediaRule>::moveAppend
          (QGenericArrayOps<QCss::MediaRule> *this,MediaRule *b,MediaRule *e)

{
  qsizetype *pqVar1;
  MediaRule *pMVar2;
  long lVar3;
  Data *pDVar4;
  QString *pQVar5;
  qsizetype qVar6;
  Data *pDVar7;
  StyleRule *pSVar8;
  
  if ((b != e) && (b < e)) {
    pMVar2 = (this->super_QArrayDataPointer<QCss::MediaRule>).ptr;
    do {
      lVar3 = (this->super_QArrayDataPointer<QCss::MediaRule>).size;
      pDVar4 = (b->media).d.d;
      (b->media).d.d = (Data *)0x0;
      pMVar2[lVar3].media.d.d = pDVar4;
      pQVar5 = (b->media).d.ptr;
      (b->media).d.ptr = (QString *)0x0;
      pMVar2[lVar3].media.d.ptr = pQVar5;
      qVar6 = (b->media).d.size;
      (b->media).d.size = 0;
      pMVar2[lVar3].media.d.size = qVar6;
      pDVar7 = (b->styleRules).d.d;
      (b->styleRules).d.d = (Data *)0x0;
      pMVar2[lVar3].styleRules.d.d = pDVar7;
      pSVar8 = (b->styleRules).d.ptr;
      (b->styleRules).d.ptr = (StyleRule *)0x0;
      pMVar2[lVar3].styleRules.d.ptr = pSVar8;
      qVar6 = (b->styleRules).d.size;
      (b->styleRules).d.size = 0;
      pMVar2[lVar3].styleRules.d.size = qVar6;
      b = b + 1;
      pqVar1 = &(this->super_QArrayDataPointer<QCss::MediaRule>).size;
      *pqVar1 = *pqVar1 + 1;
    } while (b < e);
  }
  return;
}

Assistant:

void moveAppend(T *b, T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e)
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(std::move(*b));
            ++b;
            ++this->size;
        }
    }